

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred.c
# Opt level: O2

void com_get_nbr_l(pel *dst,int ipm,int ipf,int x,int y,int width,int height,pel *srcT,pel *srcL,
                  int s_src,u16 avail_cu,int scup,com_scu_t *map_scu,int i_scu,int bit_depth)

{
  pel *__dest;
  byte *pbVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  pel pVar7;
  uint __c;
  int iVar8;
  byte *pbVar9;
  byte *pbVar10;
  com_scu_t *pcVar11;
  int iVar12;
  size_t __n;
  size_t __n_00;
  ulong uVar13;
  
  __c = 1 << ((char)bit_depth - 1U & 0x1f);
  iVar3 = height;
  if (height < width) {
    iVar3 = width;
  }
  iVar8 = iVar3 * 2 + 4;
  __n = (size_t)iVar8;
  if (ipm < 0x18 || ipf != 0) {
    __dest = dst + 1;
    if ((avail_cu & 1) == 0) {
      memset(__dest,__c,__n);
    }
    else {
      uVar2 = width >> 2;
      __n_00 = (size_t)width;
      memcpy(__dest,srcT,__n_00);
      uVar5 = 0;
      uVar13 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar13 = uVar5;
      }
      while( true ) {
        iVar12 = (int)uVar13;
        if (((int)uVar13 == (int)uVar5) ||
           (iVar12 = (int)uVar5,
           ((byte)map_scu[uVar5 + (long)(int)uVar2 + ((long)scup - (long)i_scu)] & 1) == 0)) break;
        *(undefined4 *)(__dest + uVar5 * 4 + __n_00) = *(undefined4 *)(srcT + uVar5 * 4 + __n_00);
        uVar5 = uVar5 + 1;
      }
      memset(__dest + uVar5 * 4 + __n_00,(uint)(__dest + uVar5 * 4 + __n_00)[-1],
             (long)(iVar8 - (width + iVar12 * 4)));
    }
    if (0xfffffff5 < ipm - 0xdU && ipf == 0) goto LAB_00116495;
  }
  if ((avail_cu & 2) == 0) {
    pbVar10 = dst + (iVar3 * -2 + -4);
    uVar2 = __c;
  }
  else {
    iVar3 = height >> 2;
    lVar6 = (long)s_src;
    pbVar9 = srcL;
    pbVar10 = dst;
    for (iVar12 = 0; iVar12 < height; iVar12 = iVar12 + 4) {
      pbVar10[-1] = *pbVar9;
      pbVar10[-2] = pbVar9[lVar6];
      pbVar10[-3] = pbVar9[lVar6 * 2];
      pbVar1 = pbVar9 + lVar6 * 3;
      pbVar9 = pbVar9 + lVar6 * 4;
      pbVar10[-4] = *pbVar1;
      pbVar10 = pbVar10 + -4;
    }
    pcVar11 = map_scu + (long)(i_scu * iVar3) + (long)scup + -1;
    iVar12 = 0;
    if (iVar3 < 1) {
      iVar3 = 0;
    }
    for (; (iVar4 = iVar3, iVar3 != iVar12 && (iVar4 = iVar12, ((byte)*pcVar11 & 1) != 0));
        pcVar11 = pcVar11 + i_scu) {
      pbVar10[-1] = *pbVar9;
      pbVar10[-2] = pbVar9[lVar6];
      pbVar10[-3] = pbVar9[lVar6 * 2];
      pbVar10[-4] = pbVar9[lVar6 * 3];
      pbVar10 = pbVar10 + -4;
      pbVar9 = pbVar9 + lVar6 * 4;
      iVar12 = iVar12 + 1;
    }
    __n = (size_t)(iVar8 - (height + iVar4 * 4));
    uVar2 = (uint)*pbVar10;
    pbVar10 = pbVar10 + -__n;
  }
  memset(pbVar10,uVar2,__n);
LAB_00116495:
  pVar7 = (pel)__c;
  if ((avail_cu & 4) == 0) {
    if (((avail_cu & 1) != 0) || (srcT = srcL, (avail_cu & 2) != 0)) {
      pVar7 = *srcT;
    }
  }
  else {
    pVar7 = srcT[-1];
  }
  *dst = pVar7;
  return;
}

Assistant:

void com_get_nbr_l(pel *dst, int ipm, int ipf, int x, int y, int width, int height, pel *srcT, pel *srcL, int s_src, u16 avail_cu, int scup, com_scu_t * map_scu, int i_scu, int bit_depth)
{
    int  i;
    int  width_in_scu = width >> MIN_CU_LOG2;
    int  height_in_scu = height >> MIN_CU_LOG2;
    pel *srcTL = srcT - 1;
    pel *left = dst - 1;
    pel *up = dst + 1;

    int pad_le_in_scu = height_in_scu;
    int pad_up_in_scu = width_in_scu;
    int default_val = 1 << (bit_depth - 1);
    int pad_range = COM_MAX(width, height) * 2 + 4;

    if (ipm < IPD_HOR || ipf) {
        if (IS_AVAIL(avail_cu, AVAIL_UP)) {
            com_scu_t *map_up_scu = map_scu + scup - i_scu + width_in_scu;
         
            memcpy(up, srcT, width * sizeof(pel));
            up += width, srcT += width;

            for (i = 0; i < pad_up_in_scu; i++, up += MIN_CU_SIZE, srcT += MIN_CU_SIZE) {
                if ((map_up_scu++)->coded) {
                    com_mcpy_4pel(up, srcT);
                } else {
                    break;
                }
            }
            com_mset_pel(up, up[-1], pad_range - (width + i * MIN_CU_SIZE));
        } else {
            com_mset_pel(up, default_val, pad_range);
        }
    }
    if (ipm <= IPD_BI || ipm > IPD_VER || ipf) {
        if (IS_AVAIL(avail_cu, AVAIL_LE)) {
            com_scu_t *map_left_scu = map_scu + scup - 1 + height_in_scu * i_scu;
            pel *src = srcL;

            for (i = 0; i < height; i += 4) {
                *left-- = *src;
                src += s_src;
                *left-- = *src;
                src += s_src;
                *left-- = *src;
                src += s_src;
                *left-- = *src;
                src += s_src;
            }
            for (i = 0; i < pad_le_in_scu; i++, map_left_scu += i_scu) {
                if (map_left_scu->coded) {
                    *left-- = *src;
                    src += s_src;
                    *left-- = *src;
                    src += s_src;
                    *left-- = *src;
                    src += s_src;
                    *left-- = *src;
                    src += s_src;
                } else {
                    break;
                }
            }
            int pads = pad_range - height - i * MIN_CU_SIZE;
            com_mset_pel(left - pads + 1, left[1], pads);
        } else {
            com_mset_pel(left - pad_range + 1, default_val, pad_range);
        }
    }

    if (IS_AVAIL(avail_cu, AVAIL_UL)) {
        dst[0] = srcTL[0];
    } else if (IS_AVAIL(avail_cu, AVAIL_UP)) {
        dst[0] = srcTL[1];
    } else if (IS_AVAIL(avail_cu, AVAIL_LE)) {
        dst[0] = srcL[0];
    } else {
        dst[0] = default_val;
    }
}